

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

bool ImPlot::ShowColormapSelector(char *label)

{
  ImPlotColormapData *this;
  ImPlotContext *pIVar1;
  bool bVar2;
  char *pcVar3;
  int i;
  int cmap;
  bool bVar4;
  ImVec2 local_30;
  
  pIVar1 = GImPlot;
  this = &GImPlot->ColormapData;
  pcVar3 = ImPlotColormapData::GetName(this,(GImPlot->Style).Colormap);
  cmap = 0;
  bVar2 = ImGui::BeginCombo(label,pcVar3,0);
  bVar4 = false;
  if (bVar2) {
    bVar4 = false;
    for (; cmap < (pIVar1->ColormapData).Count; cmap = cmap + 1) {
      pcVar3 = ImPlotColormapData::GetName(this,cmap);
      local_30.x = 0.0;
      local_30.y = 0.0;
      bVar2 = ImGui::Selectable(pcVar3,cmap == (pIVar1->Style).Colormap,0,&local_30);
      if (bVar2) {
        (pIVar1->Style).Colormap = cmap;
        BustItemCache();
        bVar4 = true;
      }
    }
    ImGui::EndCombo();
  }
  return bVar4;
}

Assistant:

bool ShowColormapSelector(const char* label) {
    ImPlotContext& gp = *GImPlot;
    bool set = false;
    if (ImGui::BeginCombo(label, gp.ColormapData.GetName(gp.Style.Colormap))) {
        for (int i = 0; i < gp.ColormapData.Count; ++i) {
            const char* name = gp.ColormapData.GetName(i);
            if (ImGui::Selectable(name, gp.Style.Colormap == i)) {
                gp.Style.Colormap = i;
                ImPlot::BustItemCache();
                set = true;
            }
        }
        ImGui::EndCombo();
    }
    return set;
}